

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# managed_buffer.cpp
# Opt level: O0

void __thiscall
polyscope::render::ManagedBuffer<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>::~ManagedBuffer
          (ManagedBuffer<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_> *this,void **vtt)

{
  long *in_RSI;
  long *in_RDI;
  vector<std::tuple<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>,_std::allocator<std::tuple<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>_>_>
  *unaff_retaddr;
  
  *in_RDI = *in_RSI;
  *(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18)) = in_RSI[1];
  std::shared_ptr<polyscope::render::ShaderProgram>::~shared_ptr
            ((shared_ptr<polyscope::render::ShaderProgram> *)0x428f2d);
  std::
  vector<std::tuple<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>,_std::allocator<std::tuple<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>_>_>
  ::~vector(unaff_retaddr);
  std::shared_ptr<polyscope::render::TextureBuffer>::~shared_ptr
            ((shared_ptr<polyscope::render::TextureBuffer> *)0x428f4d);
  std::shared_ptr<polyscope::render::AttributeBuffer>::~shared_ptr
            ((shared_ptr<polyscope::render::AttributeBuffer> *)0x428f5a);
  std::function<void_()>::~function((function<void_()> *)0x428f67);
  std::__cxx11::string::~string((string *)(in_RDI + 1));
  return;
}

Assistant:

ManagedBuffer<T>::~ManagedBuffer() {}